

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

int __thiscall CVmObjBigNum::abs_val(CVmObjBigNum *this,vm_val_t *retval,vm_obj_id_t self)

{
  byte *pbVar1;
  byte bVar2;
  ushort *puVar3;
  void *__dest;
  vm_datatype_t *pvVar4;
  vm_val_t *pvVar5;
  vm_obj_id_t vVar6;
  size_t digits;
  
  pvVar5 = sp_;
  bVar2 = (this->super_CVmObject).ext_[4];
  if (((bVar2 & 1) == 0) || ((bVar2 & 2) != 0)) {
    retval->typ = VM_OBJ;
    (retval->val).obj = self;
  }
  else {
    pvVar4 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar4 = VM_OBJ;
    (pvVar5->val).obj = self;
    puVar3 = (ushort *)(this->super_CVmObject).ext_;
    if ((puVar3[2] & 6) == 4) {
      digits = 1;
    }
    else {
      digits = (size_t)*puVar3;
    }
    vVar6 = create(0,digits);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar6;
    __dest = *(void **)((long)&G_obj_table_X.pages_[vVar6 >> 0xc][vVar6 & 0xfff].ptr_ + 8);
    memcpy(__dest,(this->super_CVmObject).ext_,(ulong)((int)digits + 1U >> 1) + 5);
    pbVar1 = (byte *)((long)__dest + 4);
    *pbVar1 = *pbVar1 & 0xfe;
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjBigNum::abs_val(VMG_ vm_val_t *retval, vm_obj_id_t self)
{
    /* 
     *   If I'm not an ordinary number or an infinity, or I'm already
     *   non-negative, return myself unchanged.  Note that we change negative
     *   infinity to infinity, even though this might not make a great deal
     *   of sense mathematically.  
     */
    if (!get_neg(ext_)
        || (get_type(ext_) != VMBN_T_NUM && get_type(ext_) != VMBN_T_INF))
    {
        retval->set_obj(self);
        return TRUE;
    }

    /* push a self-reference while we're working */
    G_stk->push()->set_obj(self);

    /* 
     *   if I'm negative infinity, we don't need any precision in the new
     *   value; otherwise use my original precision
     */
    size_t prec = (is_infinity(ext_) ? 1 : get_prec(ext_));

    /* create a new number with the same precision as the original */
    retval->set_obj(create(vmg_ FALSE, prec));
    char *new_ext = get_objid_ext(vmg_ retval->val.obj);

    /* make a copy in the new object */
    memcpy(new_ext, ext_, calc_alloc(prec));

    /* set the sign to positive */
    set_neg(new_ext, FALSE);

    /* remove my self-reference */
    G_stk->discard();

    /* success */
    return TRUE;
}